

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::NormalizeStats
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,float frac,float numTuples,int attrIdx1,int attrIdx2)

{
  float fVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  float *pfVar5;
  int local_44;
  iterator iStack_40;
  int attrIdx;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_int,_attrStat>_> local_30;
  iterator it;
  int attrIdx2_local;
  int attrIdx1_local;
  float numTuples_local;
  float frac_local;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
  *attr_stats_local;
  QO_Manager *this_local;
  
  it._M_node._0_4_ = attrIdx2;
  it._M_node._4_4_ = attrIdx1;
  attrIdx2_local = (int)numTuples;
  attrIdx1_local = (int)frac;
  _numTuples_local = attr_stats;
  attr_stats_local =
       (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> *)this;
  std::_Rb_tree_iterator<std::pair<const_int,_attrStat>_>::_Rb_tree_iterator(&local_30);
  local_38 = (_Base_ptr)
             std::
             map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::
             begin(_numTuples_local);
  local_30._M_node = local_38;
  while( true ) {
    iStack_40 = std::
                map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                ::end(_numTuples_local);
    bVar2 = std::operator!=(&local_30,&stack0xffffffffffffffc0);
    if (!bVar2) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_attrStat>_>::operator->(&local_30);
    local_44 = ppVar3->first;
    if ((local_44 != it._M_node._4_4_) && (local_44 != (int)it._M_node)) {
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](_numTuples_local,&local_44);
      pfVar5 = std::min<float>((float *)&attrIdx2_local,&pmVar4->numTuples);
      fVar1 = *pfVar5;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](_numTuples_local,&local_44);
      pmVar4->numTuples = fVar1;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_attrStat>_>::operator++(&local_30);
  }
  return 0;
}

Assistant:

RC QO_Manager::NormalizeStats(map<int, attrStat> &attr_stats, float frac, float numTuples, int attrIdx1, int attrIdx2){
  map<int, attrStat>::iterator it;
  for(it = attr_stats.begin(); it != attr_stats.end(); ++it){
    int attrIdx = it->first;
    if(attrIdx != attrIdx1 && attrIdx != attrIdx2){
      attr_stats[attrIdx].numTuples = min(numTuples, attr_stats[attrIdx].numTuples);
     // attr_stats[attrIdx].numTuples = attr_stats[attrIdx].numTuples*frac;
    }
  }
  return (0);
}